

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::compileAnnotation(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader source;
  Field field;
  Field field_00;
  Builder target;
  ImplicitParams implicitMethodParams;
  undefined1 auVar1 [40];
  bool bVar2;
  Field srcField;
  Field dstField;
  ArrayPtr<const_char> local_298;
  IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined6 uStack_260;
  undefined2 local_25a;
  undefined6 uStack_258;
  undefined2 uStack_252;
  undefined6 uStack_250;
  undefined1 local_24a;
  undefined1 uStack_249;
  undefined4 local_248;
  undefined4 uStack_244;
  RawBrandedSchema *local_238;
  uint uStack_230;
  undefined4 uStack_22c;
  SegmentReader *local_228;
  CapTableReader *pCStack_220;
  void *local_218;
  WirePointer *pWStack_210;
  StructDataBitCount local_208;
  StructPointerCount SStack_204;
  undefined2 uStack_202;
  int iStack_200;
  undefined4 uStack_1fc;
  RawBrandedSchema *local_1f8;
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_1f0;
  undefined1 local_1a8 [56];
  byte *pbStack_170;
  Field local_168;
  Builder local_128;
  Reader local_f8;
  Builder local_c0;
  Reader local_98;
  FieldList local_68;
  
  Declaration::Annotation::Reader::getType(&local_98,&decl);
  capnp::schema::Node::Annotation::Builder::initType(&local_c0,&builder);
  uStack_258 = 0;
  uStack_252 = 0;
  uStack_250 = 0;
  uStack_268 = 0;
  uStack_260 = 0;
  local_25a = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_24a = 7;
  local_248 = 0x7fffffff;
  implicitMethodParams.params.reader._44_4_ = uStack_244;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_249;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  source._reader.capTable = local_98._reader.capTable;
  source._reader.segment = local_98._reader.segment;
  source._reader.data = local_98._reader.data;
  source._reader.pointers = local_98._reader.pointers;
  source._reader.dataSize = local_98._reader.dataSize;
  source._reader.pointerCount = local_98._reader.pointerCount;
  source._reader._38_2_ = local_98._reader._38_2_;
  source._reader.nestingLimit = local_98._reader.nestingLimit;
  source._reader._44_4_ = local_98._reader._44_4_;
  target._builder.capTable = local_c0._builder.capTable;
  target._builder.segment = local_c0._builder.segment;
  target._builder.data = local_c0._builder.data;
  target._builder.pointers = local_c0._builder.pointers;
  target._builder.dataSize = local_c0._builder.dataSize;
  target._builder.pointerCount = local_c0._builder.pointerCount;
  target._builder._38_2_ = local_c0._builder._38_2_;
  auVar1 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar1._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar1._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar1._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar1._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar1._32_4_;
  implicitMethodParams.params.reader.step = auVar1._36_4_;
  compileType(this,source,target,implicitMethodParams);
  local_f8.reader.dataSize = decl._reader.dataSize;
  local_f8.reader.pointerCount = decl._reader.pointerCount;
  local_f8.reader._38_2_ = decl._reader._38_2_;
  local_f8.reader.nestingLimit = decl._reader.nestingLimit;
  local_f8.reader._44_4_ = decl._reader._44_4_;
  local_f8.reader.data = decl._reader.data;
  local_f8.reader.pointers = decl._reader.pointers;
  local_f8.reader.segment = decl._reader.segment;
  local_f8.reader.capTable = decl._reader.capTable;
  local_f8.schema.super_Schema.raw = (Schema)((long)schemas::s_9cb9e86e3198037f + 0x48);
  local_128.builder.dataSize = builder._builder.dataSize;
  local_128.builder.pointerCount = builder._builder.pointerCount;
  local_128.builder._38_2_ = builder._builder._38_2_;
  local_128.builder.data = builder._builder.data;
  local_128.builder.pointers = builder._builder.pointers;
  local_128.builder.segment = builder._builder.segment;
  local_128.builder.capTable = builder._builder.capTable;
  local_128.schema.super_Schema.raw = (Schema)((long)schemas::s_ec1619d4400a0290 + 0x48);
  local_1f8 = (RawBrandedSchema *)(schemas::s_9cb9e86e3198037f + 0x48);
  StructSchema::getFields(&local_68,(StructSchema *)&local_1f8);
  local_288.container = &local_68;
  for (local_288.index = 0; local_288.index != local_68.list.reader.elementCount;
      local_288.index = local_288.index + 1) {
    _::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              ((Field *)local_1a8,&local_288);
    aStack_1f0.listValue.reader.capTable = (CapTableReader *)local_1a8._48_8_;
    aStack_1f0.listValue.reader.ptr = pbStack_170;
    aStack_1f0.textValue.super_StringPtr.content.size_ = local_1a8._32_8_;
    aStack_1f0.listValue.reader.segment = (SegmentReader *)local_1a8._40_8_;
    local_1f8 = (RawBrandedSchema *)local_1a8._16_8_;
    aStack_1f0.intValue = local_1a8._24_8_;
    local_298 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_1f8);
    local_1f8 = (RawBrandedSchema *)0x1daaf0;
    aStack_1f0.intValue = 8;
    bVar2 = kj::StringPtr::startsWith((StringPtr *)&local_298,(StringPtr *)&local_1f8);
    if (bVar2) {
      local_1f8 = (RawBrandedSchema *)local_128.schema.super_Schema.raw;
      StructSchema::getFieldByName(&local_168,(StructSchema *)&local_1f8,(StringPtr)local_298);
      local_238 = (RawBrandedSchema *)local_168.parent.super_Schema.raw;
      uStack_230 = local_168.index;
      uStack_22c = local_168._12_4_;
      local_228 = local_168.proto._reader.segment;
      pCStack_220 = local_168.proto._reader.capTable;
      local_218 = local_168.proto._reader.data;
      pWStack_210 = local_168.proto._reader.pointers;
      local_208 = local_168.proto._reader.dataSize;
      SStack_204 = local_168.proto._reader.pointerCount;
      uStack_202 = local_168.proto._reader._38_2_;
      iStack_200 = local_168.proto._reader.nestingLimit;
      uStack_1fc = local_168.proto._reader._44_4_;
      field._8_8_ = local_1a8._8_8_;
      field.parent.super_Schema.raw = (Schema)(Schema)local_1a8._0_8_;
      field.proto._reader.segment = (SegmentReader *)local_1a8._16_8_;
      field.proto._reader.capTable = (CapTableReader *)local_1a8._24_8_;
      field.proto._reader.data = (void *)local_1a8._32_8_;
      field.proto._reader.pointers = (WirePointer *)local_1a8._40_8_;
      field.proto._reader.dataSize = local_1a8._48_4_;
      field.proto._reader.pointerCount = local_1a8._52_2_;
      field.proto._reader._38_2_ = local_1a8._54_2_;
      field.proto._reader._40_8_ = pbStack_170;
      DynamicStruct::Reader::get((Reader *)&local_1f8,&local_f8,field);
      field_00.index = uStack_230;
      field_00._12_4_ = uStack_22c;
      field_00.parent.super_Schema.raw = (Schema)(Schema)local_238;
      field_00.proto._reader.segment = local_228;
      field_00.proto._reader.capTable = pCStack_220;
      field_00.proto._reader.data = local_218;
      field_00.proto._reader.pointers = pWStack_210;
      field_00.proto._reader.dataSize = local_208;
      field_00.proto._reader.pointerCount = SStack_204;
      field_00.proto._reader._38_2_ = uStack_202;
      field_00.proto._reader.nestingLimit = iStack_200;
      field_00.proto._reader._44_4_ = uStack_1fc;
      DynamicStruct::Builder::set(&local_128,field_00,(Reader *)&local_1f8);
      DynamicValue::Reader::~Reader((Reader *)&local_1f8);
    }
  }
  return;
}

Assistant:

void NodeTranslator::compileAnnotation(Declaration::Annotation::Reader decl,
                                       schema::Node::Annotation::Builder builder) {
  compileType(decl.getType(), builder.initType(), noImplicitParams());

  // Dynamically copy over the values of all of the "targets" members.
  DynamicStruct::Reader src = decl;
  DynamicStruct::Builder dst = builder;
  for (auto srcField: src.getSchema().getFields()) {
    kj::StringPtr fieldName = srcField.getProto().getName();
    if (fieldName.startsWith("targets")) {
      auto dstField = dst.getSchema().getFieldByName(fieldName);
      dst.set(dstField, src.get(srcField));
    }
  }
}